

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUseMangledMesaCommand.cxx
# Opt level: O1

void __thiscall
cmUseMangledMesaCommand::CopyAndFullPathMesaHeader
          (cmUseMangledMesaCommand *this,char *source,char *outdir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  size_t sVar4;
  ostream *poVar5;
  size_type *psVar6;
  string gfile;
  string includeFile;
  string inLine;
  string tempOutputFile;
  string outFile;
  string file;
  string dir;
  RegularExpression includeLine;
  ifstream fin;
  RegularExpression glDirLine;
  ofstream fout;
  RegularExpression glLine;
  char *local_788;
  long local_780;
  char local_778;
  undefined7 uStack_777;
  char *local_768;
  undefined8 local_760;
  char local_758;
  undefined7 uStack_757;
  string local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  undefined1 local_6a8 [80];
  char *local_658;
  char *local_650;
  char *local_608;
  char *local_5e8;
  string local_5d8;
  byte abStack_5b8 [488];
  RegularExpression local_3d0;
  undefined1 local_300 [32];
  byte abStack_2e0 [216];
  ios_base local_208 [264];
  RegularExpression local_100;
  
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  local_6c8._M_string_length = 0;
  local_6c8.field_2._M_local_buf[0] = '\0';
  local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
  local_6e8._M_string_length = 0;
  local_6e8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d8,source,(allocator<char> *)local_300);
  cmsys::SystemTools::SplitProgramPath(&local_5d8,&local_6c8,&local_6e8,true);
  paVar1 = &local_5d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_708,outdir,(allocator<char> *)&local_5d8);
  std::__cxx11::string::append((char *)&local_708);
  std::__cxx11::string::_M_append((char *)&local_708,(ulong)local_6e8._M_dataplus._M_p);
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_728,local_708._M_dataplus._M_p,
             local_708._M_dataplus._M_p + local_708._M_string_length);
  std::__cxx11::string::append((char *)&local_728);
  std::ofstream::ofstream(local_300,local_728._M_dataplus._M_p,_S_out);
  if ((abStack_2e0[(long)*(_func_int **)(local_300._0_8_ + -0x18)] & 5) == 0) {
    std::ifstream::ifstream(&local_5d8,source,_S_in);
    if ((abStack_5b8[*(long *)(local_5d8._M_dataplus._M_p + -0x18)] & 5) == 0) {
      local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
      local_748._M_string_length = 0;
      local_748.field_2._M_local_buf[0] = '\0';
      local_6a8._0_8_ = (pointer)0x0;
      local_658 = (char *)0x0;
      local_608 = (char *)0x0;
      local_5e8 = (char *)0x0;
      cmsys::RegularExpression::compile
                ((RegularExpression *)local_6a8,"^[ \t]*#[ \t]*include[ \t]*[<\"]([^\">]+)[\">]");
      local_3d0.regmatch.startp[0] = (char *)0x0;
      local_3d0.regmatch.endp[0] = (char *)0x0;
      local_3d0.regmatch.searchstring = (char *)0x0;
      local_3d0.program = (char *)0x0;
      cmsys::RegularExpression::compile(&local_3d0,"(gl|GL)(/|\\\\)([^<\"]+)");
      local_100.regmatch.startp[0] = (char *)0x0;
      local_100.regmatch.endp[0] = (char *)0x0;
      local_100.regmatch.searchstring = (char *)0x0;
      local_100.program = (char *)0x0;
      cmsys::RegularExpression::compile(&local_100,"(gl|GL|xmesa)");
      while( true ) {
        bVar2 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&local_5d8,&local_748,(bool *)0x0,-1);
        if (!bVar2) break;
        bVar2 = cmsys::RegularExpression::find
                          ((RegularExpression *)local_6a8,local_748._M_dataplus._M_p,
                           (RegularExpressionMatch *)local_6a8);
        if (bVar2) {
          if ((char *)local_6a8._8_8_ == (char *)0x0) {
            local_768 = &local_758;
            local_760 = 0;
            local_758 = '\0';
          }
          else {
            local_768 = &local_758;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_768,local_6a8._8_8_,local_650);
          }
          bVar2 = cmsys::RegularExpression::find(&local_3d0,local_768,&local_3d0.regmatch);
          if (bVar2) {
            if (local_3d0.regmatch.startp[3] == (char *)0x0) {
              local_788 = &local_778;
              local_780 = 0;
              local_778 = '\0';
            }
            else {
              local_788 = &local_778;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_788,local_3d0.regmatch.startp[3],
                         local_3d0.regmatch.endp[3]);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_300,"#include \"",10);
            if (outdir == (char *)0x0) {
              std::ios::clear((int)&local_788 + (int)*(_func_int **)(local_300._0_8_ + -0x18) +
                              0x488);
            }
            else {
              sVar4 = strlen(outdir);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,outdir,sVar4);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,"/",1);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_300,local_788,local_780);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
LAB_00232615:
            if (local_788 != &local_778) {
              operator_delete(local_788,CONCAT71(uStack_777,local_778) + 1);
            }
          }
          else {
            bVar2 = cmsys::RegularExpression::find(&local_100,local_768,&local_100.regmatch);
            if (bVar2) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_300,"#include \"",10);
              if (outdir == (char *)0x0) {
                std::ios::clear((int)&local_788 + (int)*(_func_int **)(local_300._0_8_ + -0x18) +
                                0x488);
              }
              else {
                sVar4 = strlen(outdir);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_300,outdir,sVar4);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,"/",1);
              if ((char *)local_6a8._8_8_ == (char *)0x0) {
                local_788 = &local_778;
                local_780 = 0;
                local_778 = '\0';
              }
              else {
                local_788 = &local_778;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_788,local_6a8._8_8_,local_650);
              }
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_300,local_788,local_780);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
              goto LAB_00232615;
            }
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_300,local_748._M_dataplus._M_p,
                                local_748._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          }
          if (local_768 != &local_758) {
            operator_delete(local_768,CONCAT71(uStack_757,local_758) + 1);
          }
        }
        else {
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_300,local_748._M_dataplus._M_p,
                              local_748._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        }
      }
      std::ifstream::close();
      std::ofstream::close();
      cmsys::SystemTools::CopyFileIfDifferent(&local_728,&local_708);
      cmsys::SystemTools::RemoveFile(&local_728);
      if (local_100.program != (char *)0x0) {
        operator_delete__(local_100.program);
      }
      if (local_3d0.program != (char *)0x0) {
        operator_delete__(local_3d0.program);
      }
      if (local_5e8 != (char *)0x0) {
        operator_delete__(local_5e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_748._M_dataplus._M_p != &local_748.field_2) {
        operator_delete(local_748._M_dataplus._M_p,
                        CONCAT71(local_748.field_2._M_allocated_capacity._1_7_,
                                 local_748.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      cmSystemTools::Error
                ("Could not open file for read in copy operation",source,(char *)0x0,(char *)0x0);
    }
    std::ifstream::~ifstream(&local_5d8);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a8,
                   "Could not open file for write in copy operation: ",&local_728);
    plVar3 = (long *)std::__cxx11::string::append(local_6a8);
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_5d8.field_2._M_allocated_capacity = *psVar6;
      local_5d8.field_2._8_8_ = plVar3[3];
      local_5d8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_5d8.field_2._M_allocated_capacity = *psVar6;
      local_5d8._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_5d8._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    cmSystemTools::Error(&local_5d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
      operator_delete((void *)local_6a8._0_8_,local_6a8._16_8_ + 1);
    }
    cmSystemTools::ReportLastSystemError("");
  }
  local_300._0_8_ = _VTT;
  *(undefined8 *)(local_300 + (long)_VTT[-3]) = _vtable;
  std::filebuf::~filebuf((filebuf *)(local_300 + 8));
  std::ios_base::~ios_base(local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p,local_728.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._M_dataplus._M_p != &local_708.field_2) {
    operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p,
                    CONCAT71(local_6e8.field_2._M_allocated_capacity._1_7_,
                             local_6e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,
                    CONCAT71(local_6c8.field_2._M_allocated_capacity._1_7_,
                             local_6c8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmUseMangledMesaCommand::CopyAndFullPathMesaHeader(const char* source,
                                                        const char* outdir)
{
  std::string dir, file;
  cmSystemTools::SplitProgramPath(source, dir, file);
  std::string outFile = outdir;
  outFile += "/";
  outFile += file;
  std::string tempOutputFile = outFile;
  tempOutputFile += ".tmp";
  cmsys::ofstream fout(tempOutputFile.c_str());
  if (!fout) {
    cmSystemTools::Error("Could not open file for write in copy operation: " +
                         tempOutputFile + outdir);
    cmSystemTools::ReportLastSystemError("");
    return;
  }
  cmsys::ifstream fin(source);
  if (!fin) {
    cmSystemTools::Error("Could not open file for read in copy operation",
                         source);
    return;
  }
  // now copy input to output and expand variables in the
  // input file at the same time
  std::string inLine;
  // regular expression for any #include line
  cmsys::RegularExpression includeLine(
    "^[ \t]*#[ \t]*include[ \t]*[<\"]([^\">]+)[\">]");
  // regular expression for gl/ or GL/ in a file (match(1) of above)
  cmsys::RegularExpression glDirLine("(gl|GL)(/|\\\\)([^<\"]+)");
  // regular expression for gl GL or xmesa in a file (match(1) of above)
  cmsys::RegularExpression glLine("(gl|GL|xmesa)");
  while (cmSystemTools::GetLineFromStream(fin, inLine)) {
    if (includeLine.find(inLine)) {
      std::string includeFile = includeLine.match(1);
      if (glDirLine.find(includeFile)) {
        std::string gfile = glDirLine.match(3);
        fout << "#include \"" << outdir << "/" << gfile << "\"\n";
      } else if (glLine.find(includeFile)) {
        fout << "#include \"" << outdir << "/" << includeLine.match(1)
             << "\"\n";
      } else {
        fout << inLine << "\n";
      }
    } else {
      fout << inLine << "\n";
    }
  }
  // close the files before attempting to copy
  fin.close();
  fout.close();
  cmSystemTools::CopyFileIfDifferent(tempOutputFile, outFile);
  cmSystemTools::RemoveFile(tempOutputFile);
}